

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1d0;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  tv_test_start = tutil_tvnow();
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    lVar7 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                  ,0x36);
    iVar1 = 0x7c;
    goto LAB_001023bf;
  }
  iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar2,0x2a,1);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0x40,0);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x51,0);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          lVar7 = curl_multi_init();
          if (lVar7 == 0) {
            lVar7 = 0;
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                          ,0x3f);
            iVar1 = 0x7b;
            goto LAB_001023bf;
          }
          iVar1 = curl_multi_add_handle(lVar7,lVar2);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_multi_perform(lVar7,&still_running);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              if (still_running < 0) {
                pcVar6 = 
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ;
                uStack_1d0 = 0x45;
LAB_00102619:
                curl_mfprintf(_stderr,pcVar6,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                              ,uStack_1d0);
                iVar1 = 0x7a;
              }
              else {
                tVar9 = tutil_tvnow();
                lVar4 = tutil_tvdiff(tVar9,tv_test_start);
                if (lVar4 < 0xea61) {
                  if (still_running == 0) {
                    iVar1 = 0;
                  }
                  else {
                    do {
                      maxfd = -99;
                      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                        fdread.__fds_bits[lVar4] = 0;
                      }
                      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                        fdwrite.__fds_bits[lVar4] = 0;
                      }
                      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                        fdexcep.__fds_bits[lVar4] = 0;
                      }
                      timeout.tv_sec = 1;
                      timeout.tv_usec = 0;
                      iVar1 = curl_multi_fdset(lVar7,&fdread,&fdwrite,&fdexcep,&maxfd);
                      uVar8 = _stderr;
                      if (iVar1 != 0) {
                        uVar3 = curl_multi_strerror(iVar1);
                        pcVar6 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                        uStack_1d0 = 0x5a;
                        goto LAB_001023ae;
                      }
                      if (maxfd < -1) {
                        pcVar6 = 
                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                        ;
                        uStack_1d0 = 0x5a;
                        goto LAB_00102619;
                      }
                      iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
                      if (iVar1 == -1) {
                        piVar5 = __errno_location();
                        uVar8 = _stderr;
                        iVar1 = *piVar5;
                        pcVar6 = strerror(iVar1);
                        curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                      ,0x5e,iVar1,pcVar6);
                        iVar1 = 0x79;
                        break;
                      }
                      tVar9 = tutil_tvnow();
                      lVar4 = tutil_tvdiff(tVar9,tv_test_start);
                      if (60000 < lVar4) {
                        uStack_1d0 = 0x60;
                        goto LAB_00102642;
                      }
                      iVar1 = curl_multi_perform(lVar7,&still_running);
                      uVar8 = _stderr;
                      if (iVar1 != 0) {
                        uVar3 = curl_multi_strerror(iVar1);
                        pcVar6 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uStack_1d0 = 99;
                        goto LAB_001023ae;
                      }
                      if (still_running < 0) {
                        pcVar6 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uStack_1d0 = 99;
                        goto LAB_00102619;
                      }
                      tVar9 = tutil_tvnow();
                      lVar4 = tutil_tvdiff(tVar9,tv_test_start);
                      if (60000 < lVar4) {
                        uStack_1d0 = 0x65;
                        goto LAB_00102642;
                      }
                      iVar1 = 0;
                    } while (still_running != 0);
                  }
                }
                else {
                  uStack_1d0 = 0x47;
LAB_00102642:
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                ,uStack_1d0);
                  iVar1 = 0x7d;
                }
              }
              goto LAB_001023bf;
            }
            uVar3 = curl_multi_strerror(iVar1);
            pcVar6 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uStack_1d0 = 0x45;
          }
          else {
            uVar3 = curl_multi_strerror(iVar1);
            pcVar6 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uStack_1d0 = 0x42;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar7 = 0;
          uStack_1d0 = 0x3c;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar7 = 0;
        uStack_1d0 = 0x3b;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x3a;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar7 = 0;
    uStack_1d0 = 0x39;
  }
LAB_001023ae:
  curl_mfprintf(uVar8,pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                ,uStack_1d0,iVar1,uVar3);
LAB_001023bf:
  curl_multi_cleanup(lVar7);
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}